

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void setup_var_ref(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_insn_t insn,size_t nop,size_t insn_num,
                  int def_p)

{
  bitmap_t *ppVVar1;
  undefined8 *puVar2;
  MIR_op_t *pMVar3;
  undefined1 auVar4 [32];
  char cVar5;
  MIR_reg_t MVar6;
  VARR_size_t *pVVar7;
  VARR_var_ref_t *pVVar8;
  VARR_var_ref_t *pVVar9;
  MIR_context_t insn_00;
  VARR_MIR_op_t *pVVar10;
  bitmap_t pVVar11;
  MIR_item_t pMVar12;
  long lVar13;
  uint uVar14;
  void *pvVar15;
  VARR_MIR_proto_t *pVVar16;
  VARR_uint8_t *pVVar17;
  VARR_uint8_t *pVVar18;
  VARR_uint8_t *pVVar19;
  HTAB_MIR_item_t *pHVar20;
  undefined1 auVar21 [32];
  gen_ctx *pgVar22;
  int iVar23;
  gen_ctx_t pgVar24;
  var_ref_t *pvVar25;
  gen_ctx_t __ptr;
  MIR_insn_t pMVar26;
  VARR_MIR_reg_t *pVVar27;
  size_t *psVar28;
  bool bVar29;
  combine_ctx *pcVar30;
  ulong uVar31;
  int *piVar32;
  undefined1 *puVar33;
  long *extraout_RDX;
  long extraout_RDX_00;
  ulong uVar34;
  size_t sVar35;
  uint *puVar36;
  undefined8 uVar37;
  size_t nop_00;
  MIR_context_t __size;
  gen_ctx_t gen_ctx_00;
  long lVar38;
  MIR_op_t *pMVar39;
  anon_union_32_12_57d33f68_for_u *paVar40;
  undefined1 *unaff_R14;
  char cStack_108;
  int iStack_104;
  ulong uStack_100;
  MIR_context_t pMStack_f8;
  MIR_reg_t MStack_f0;
  MIR_reg_t MStack_ec;
  long *plStack_e8;
  MIR_op_t *pMStack_e0;
  undefined8 uStack_d8;
  gen_ctx *pgStack_d0;
  gen_ctx_t pgStack_c8;
  MIR_insn_t pMStack_c0;
  size_t sStack_b8;
  void *pvStack_b0;
  undefined8 uStack_a8;
  int64_t iStack_a0;
  char *pcStack_98;
  undefined8 uStack_90;
  MIR_disp_t MStack_88;
  VARR_var_ref_t *pVStack_78;
  MIR_insn_t pMStack_70;
  gen_ctx_t pgStack_68;
  undefined1 *puStack_60;
  size_t sStack_58;
  code *pcStack_50;
  int local_3c;
  size_t local_38;
  
  if (var == 0xffffffff) {
    return;
  }
  pcVar30 = gen_ctx->combine_ctx;
  if (pcVar30->var_refs == (VARR_var_ref_t *)0x0) {
LAB_00170d5c:
    pcStack_50 = (code *)0x170d61;
    setup_var_ref_cold_6();
  }
  else if (pcVar30->var_ref_ages != (VARR_size_t *)0x0) {
    uVar31 = pcVar30->var_refs->els_num;
    if (uVar31 != pcVar30->var_ref_ages->els_num) goto LAB_00170d66;
    uVar34 = (ulong)var;
    gen_ctx_00 = gen_ctx;
    local_3c = def_p;
    local_38 = insn_num;
    if (uVar34 < uVar31) {
      pvVar25 = pcVar30->var_refs_addr;
      psVar28 = pcVar30->var_ref_ages_addr;
LAB_00170d0e:
      psVar28[uVar34] = pcVar30->curr_bb_var_ref_age;
      pvVar25[uVar34].insn = insn;
      pvVar25[uVar34].nop = nop;
      pvVar25[uVar34].insn_num = insn_num;
      pvVar25[uVar34].def_p = (char)def_p;
      pvVar25[uVar34].del_p = '\0';
      return;
    }
    do {
      pVVar7 = pcVar30->var_ref_ages;
      pgVar24 = (gen_ctx_t)pVVar7->varr;
      if (pgVar24 == (gen_ctx_t)0x0) {
LAB_00170d4c:
        pcStack_50 = (code *)0x170d54;
        setup_var_ref_cold_4();
LAB_00170d54:
        pcStack_50 = (code *)0x170d5c;
        setup_var_ref_cold_3();
        goto LAB_00170d5c;
      }
      __size = (MIR_context_t)pVVar7->els_num;
      puVar33 = (undefined1 *)((long)&__size->gen_ctx + 1);
      if ((undefined1 *)pVVar7->size < puVar33) {
        unaff_R14 = puVar33 + ((ulong)puVar33 >> 1);
        pcStack_50 = (code *)0x170c56;
        gen_ctx_00 = pgVar24;
        pgVar24 = (gen_ctx_t)realloc(pgVar24,(long)unaff_R14 * 8);
        pVVar7->varr = (size_t *)pgVar24;
        pVVar7->size = (size_t)unaff_R14;
        __size = (MIR_context_t)pVVar7->els_num;
        pcVar30 = gen_ctx->combine_ctx;
        puVar33 = (undefined1 *)((long)&__size->gen_ctx + 1);
      }
      pVVar7->els_num = (size_t)puVar33;
      pgVar24->call_used_hard_regs[(long)((long)&__size[-1].setjmp_addr + 3)] = (bitmap_t)0x0;
      pVVar8 = pcVar30->var_refs;
      pgVar24 = (gen_ctx_t)pVVar8->varr;
      if (pgVar24 == (gen_ctx_t)0x0) goto LAB_00170d54;
      sVar35 = pVVar8->els_num;
      uVar31 = sVar35 + 1;
      if (pVVar8->size < uVar31) {
        unaff_R14 = (undefined1 *)((uVar31 >> 1) + uVar31);
        __size = (MIR_context_t)((long)unaff_R14 * 0x20);
        pcStack_50 = (code *)0x170cb0;
        gen_ctx_00 = pgVar24;
        pgVar24 = (gen_ctx_t)realloc(pgVar24,(size_t)__size);
        pVVar8->varr = (var_ref_t *)pgVar24;
        pVVar8->size = (size_t)unaff_R14;
        sVar35 = pVVar8->els_num;
        uVar31 = sVar35 + 1;
      }
      pVVar8->els_num = uVar31;
      ppVVar1 = pgVar24->call_used_hard_regs + sVar35 * 4 + -0xd;
      *ppVVar1 = (bitmap_t)0x0;
      ppVVar1[1] = (bitmap_t)0x0;
      ppVVar1[2] = (bitmap_t)0x0;
      ppVVar1[3] = (bitmap_t)0x0;
      pcVar30 = gen_ctx->combine_ctx;
      pVVar9 = pcVar30->var_refs;
      if (pVVar9 == (VARR_var_ref_t *)0x0) {
        pcStack_50 = (code *)0x170d4c;
        setup_var_ref_cold_2();
        goto LAB_00170d4c;
      }
    } while (pVVar9->els_num <= uVar34);
    pvVar25 = pVVar9->varr;
    pcVar30->var_refs_addr = pvVar25;
    if (pcVar30->var_ref_ages != (VARR_size_t *)0x0) {
      psVar28 = pcVar30->var_ref_ages->varr;
      pcVar30->var_ref_ages_addr = psVar28;
      insn_num = local_38;
      def_p = local_3c;
      goto LAB_00170d0e;
    }
    pcStack_50 = combine_substitute;
    setup_var_ref_cold_1();
    pgStack_d0 = __size->gen_ctx;
    insn_00 = pgStack_d0->ctx;
    uStack_100 = *(ulong *)&insn_00->func_redef_permission_p >> 0x20;
    if (uStack_100 == 0) {
      return;
    }
    pVVar10 = gen_ctx_00->combine_ctx->last_right_ops;
    pgVar24 = gen_ctx_00;
    pMStack_f8 = __size;
    pVStack_78 = pVVar8;
    pMStack_70 = insn;
    pgStack_68 = gen_ctx;
    puStack_60 = unaff_R14;
    sStack_58 = nop;
    pcStack_50 = (code *)uVar34;
    if ((pVVar10 == (VARR_MIR_op_t *)0x0) || (pVVar10->varr == (MIR_op_t *)0x0)) {
LAB_00171557:
      combine_substitute_cold_13();
LAB_0017155c:
      combine_substitute_cold_11();
LAB_00171564:
      combine_substitute_cold_10();
LAB_0017156c:
      combine_substitute_cold_6();
    }
    else {
      pgStack_c8 = (gen_ctx_t)gen_ctx_00->ctx;
      pVVar10->els_num = 0;
      lVar38 = 0;
      lVar13 = uStack_100 * 0x30;
      plStack_e8 = extraout_RDX;
      do {
        puVar2 = (undefined8 *)((long)&((MIR_op_t *)&insn_00->insn_nops)->data + lVar38);
        pvStack_b0 = (void *)*puVar2;
        uStack_a8 = puVar2[1];
        iStack_a0 = puVar2[2];
        pcStack_98 = (char *)puVar2[3];
        uStack_90 = *(undefined8 *)((long)&insn_00->used_label_p + lVar38);
        MStack_88 = *(undefined8 *)((long)&insn_00->module_item_tab + lVar38);
        pVVar10 = gen_ctx_00->combine_ctx->last_right_ops;
        __ptr = (gen_ctx_t)pVVar10->varr;
        if (__ptr == (gen_ctx_t)0x0) {
          combine_substitute_cold_12();
          goto LAB_00171508;
        }
        sVar35 = pVVar10->els_num;
        uVar31 = sVar35 + 1;
        if (pVVar10->size < uVar31) {
          sVar35 = (uVar31 >> 1) + uVar31;
          __size = (MIR_context_t)(sVar35 * 0x30);
          pgVar24 = __ptr;
          __ptr = (gen_ctx_t)realloc(__ptr,(size_t)__size);
          pVVar10->varr = (MIR_op_t *)__ptr;
          pVVar10->size = sVar35;
          sVar35 = pVVar10->els_num;
          uVar31 = sVar35 + 1;
        }
        pgVar22 = pgStack_d0;
        pVVar10->els_num = uVar31;
        lVar38 = lVar38 + 0x30;
        auVar4._8_8_ = uStack_a8;
        auVar4._0_8_ = pvStack_b0;
        auVar4._16_8_ = iStack_a0;
        auVar4._24_8_ = pcStack_98;
        auVar21._8_8_ = pcStack_98;
        auVar21._0_8_ = iStack_a0;
        auVar21._16_8_ = uStack_90;
        auVar21._24_8_ = MStack_88;
        *(undefined1 (*) [32])(__ptr->call_used_hard_regs + sVar35 * 6 + -0xb) = auVar21;
        *(undefined1 (*) [32])(__ptr->call_used_hard_regs + sVar35 * 6 + -0xd) = auVar4;
      } while (lVar13 != lVar38);
      pcVar30 = gen_ctx_00->combine_ctx;
      pVVar27 = pcVar30->insn_vars;
      if ((pVVar27 == (VARR_MIR_reg_t *)0x0) || (pVVar27->varr == (MIR_reg_t *)0x0))
      goto LAB_0017155c;
      pVVar27->els_num = 0;
      pVVar11 = pcVar30->vars_bitmap;
      if ((pVVar11 == (bitmap_t)0x0) || (pVVar11->varr == (bitmap_el_t *)0x0)) goto LAB_00171564;
      puVar36 = (uint *)((long)&insn_00->used_label_p + 4);
      sVar35 = 0;
      pVVar11->els_num = 0;
      do {
        __size = insn_00;
        pgVar24 = pgStack_c8;
        MIR_insn_op_mode((MIR_context_t)pgStack_c8,(MIR_insn_t_conflict)insn_00,sVar35,&iStack_104);
        if ((iStack_104 == 0) && (cVar5 = (char)puVar36[-7], cVar5 != '\v')) {
          if (cVar5 == '\v') {
            if (puVar36[-1] != 0xffffffff) {
              pgVar24 = gen_ctx_00;
              combine_process_var(gen_ctx_00,puVar36[-1],(bb_insn_t_conflict)pgVar22);
            }
            __size = (MIR_context_t)(ulong)*puVar36;
            if (*puVar36 != 0xffffffff) goto LAB_00170f63;
          }
          else if (cVar5 == '\x02') {
            __size = (MIR_context_t)(ulong)puVar36[-5];
LAB_00170f63:
            pgVar24 = gen_ctx_00;
            combine_process_var(gen_ctx_00,(MIR_reg_t)__size,(bb_insn_t_conflict)pgVar22);
          }
        }
        sVar35 = sVar35 + 1;
        puVar36 = puVar36 + 0xc;
      } while (uStack_100 != sVar35);
      if (((insn_00->func_redef_permission_p & 0xfffffffcU) != 0) ||
         (*(char *)&(insn_00->environment_module).name != '\x02')) goto LAB_00171048;
      pVVar27 = gen_ctx_00->combine_ctx->insn_vars;
      if (pVVar27 != (VARR_MIR_reg_t *)0x0) {
        if (pVVar27->els_num == 0) {
LAB_00171048:
          pVVar27 = gen_ctx_00->combine_ctx->insn_vars;
          if (pVVar27 == (VARR_MIR_reg_t *)0x0) {
LAB_00171508:
            combine_substitute_cold_8();
LAB_00171510:
            combine_substitute_cold_7();
LAB_00171518:
            __assert_fail("op_ref->mode != MIR_OP_VAR_MEM || (op_ref->u.var_mem.base != var && op_ref->u.var_mem.index != var)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x228a,"int combine_substitute(gen_ctx_t, bb_insn_t *, long *)");
          }
          pMStack_f8 = (MIR_context_t)((long)&insn_00->used_label_p + 4);
          pMVar39 = (MIR_op_t *)&insn_00->insn_nops;
          uVar37 = 0;
          sStack_b8 = uStack_100 - 1;
LAB_00171078:
          sVar35 = pVVar27->els_num;
          if (sVar35 == 0) {
            return;
          }
          if (pVVar27->varr != (MIR_reg_t *)0x0) {
            pVVar27->els_num = sVar35 - 1;
            MVar6 = pVVar27->varr[sVar35 - 1];
            pMVar26 = get_uptodate_def_insn(gen_ctx_00,MVar6);
            if ((pMVar26 != (MIR_insn_t)0x0) && ((*(uint *)&pMVar26->field_0x18 & 0xfffffffc) == 0))
            {
              pMStack_c0 = pMVar26 + 1;
              bVar29 = true;
              sVar35 = 0;
              pMStack_e0 = pMVar39;
              uStack_d8 = uVar37;
              do {
                paVar40 = (anon_union_32_12_57d33f68_for_u *)(&pMStack_f8->gen_ctx + sVar35 * 6);
                nop_00 = sVar35;
                while( true ) {
                  __size = insn_00;
                  pgVar24 = pgStack_c8;
                  MIR_insn_op_mode((MIR_context_t)pgStack_c8,(MIR_insn_t_conflict)insn_00,nop_00,
                                   &iStack_104);
                  if (((iStack_104 == 0) && ((char)(&paVar40->reg)[-7] == '\x02')) &&
                     ((&paVar40->reg)[-5] == MVar6)) break;
                  if (((char)(&paVar40->reg)[-7] == '\v') &&
                     (((&paVar40->reg)[-1] == MVar6 || (paVar40->reg == MVar6)))) goto LAB_00171518;
                  nop_00 = nop_00 + 1;
                  paVar40 = (anon_union_32_12_57d33f68_for_u *)(&paVar40->reg + 0xc);
                  if (uStack_100 == nop_00) {
                    uVar37 = uStack_d8;
                    pMVar39 = pMStack_e0;
                    if (bVar29) goto LAB_001710ba;
                    goto LAB_001711fd;
                  }
                }
                auVar4 = *(undefined1 (*) [32])pMStack_c0;
                *(undefined1 (*) [32])(&paVar40->reg + -5) =
                     *(undefined1 (*) [32])&(pMStack_c0->insn_link).next;
                *(undefined1 (*) [32])(&paVar40->reg + -9) = auVar4;
                pVVar7 = gen_ctx_00->combine_ctx->changed_op_numbers;
                psVar28 = pVVar7->varr;
                if (psVar28 == (size_t *)0x0) goto LAB_0017156c;
                sVar35 = pVVar7->els_num;
                uVar31 = sVar35 + 1;
                if (pVVar7->size < uVar31) {
                  sVar35 = (uVar31 >> 1) + uVar31;
                  psVar28 = (size_t *)realloc(psVar28,sVar35 * 8);
                  pVVar7->varr = psVar28;
                  pVVar7->size = sVar35;
                  sVar35 = pVVar7->els_num;
                  uVar31 = sVar35 + 1;
                }
                pVVar7->els_num = uVar31;
                psVar28[sVar35] = nop_00;
                sVar35 = nop_00 + 1;
                bVar29 = false;
              } while (sStack_b8 != nop_00);
LAB_001711fd:
              __size = insn_00;
              pgVar24 = gen_ctx_00;
              iVar23 = find_insn_pattern(gen_ctx_00,(MIR_insn_t)insn_00,(int *)0x0);
              pgVar22 = pgStack_d0;
              pMVar39 = pMStack_e0;
              pcVar30 = gen_ctx_00->combine_ctx;
              pVVar7 = pcVar30->changed_op_numbers;
              do {
                if (pVVar7 == (VARR_size_t *)0x0) {
LAB_00171547:
                  combine_substitute_cold_5();
LAB_0017154f:
                  combine_substitute_cold_4();
                  goto LAB_00171557;
                }
                __size = (MIR_context_t)pVVar7->els_num;
                if (__size == (MIR_context_t)0x0) goto LAB_001712ff;
                pgVar24 = (gen_ctx_t)pVVar7->varr;
                if (pgVar24 == (gen_ctx_t)0x0) goto LAB_0017154f;
                pVVar7->els_num = (size_t)((long)&__size[-1].wrapper_end_addr + 7);
                __size = (MIR_context_t)
                         pgVar24->call_used_hard_regs[(long)((long)&__size[-1].setjmp_addr + 2)];
                if (iVar23 < 0) {
                  pgVar24 = (gen_ctx_t)pcVar30->last_right_ops;
                  if (((pgVar24 == (gen_ctx_t)0x0) ||
                      (pMVar12 = pgVar24->curr_func_item, pMVar12 == (MIR_item_t)0x0)) ||
                     (pgVar24->ctx <= __size)) goto LAB_0017153f;
                  pgVar24 = *(gen_ctx_t *)(&pMVar12->item_type + (long)__size * 0xc);
                  auVar4 = *(undefined1 (*) [32])(&pMVar12->data + (long)__size * 6);
                  pMVar3 = pMStack_e0 + (long)__size;
                  *(gen_ctx_t *)((long)&pMVar3->u + 0x10) = pgVar24;
                  pMVar12 = (&pMVar12->ref_def)[(long)__size * 6];
                  *(undefined1 (*) [32])pMVar3 = auVar4;
                  (pMVar3->u).mem.disp = (MIR_disp_t)pMVar12;
                }
                else {
                  pgVar24 = (gen_ctx_t)pcVar30->last_right_ops;
                  if (((pgVar24 == (gen_ctx_t)0x0) ||
                      (pMVar12 = pgVar24->curr_func_item, pMVar12 == (MIR_item_t)0x0)) ||
                     (pgVar24->ctx <= __size)) {
                    combine_substitute_cold_2();
LAB_0017153f:
                    combine_substitute_cold_3();
                    goto LAB_00171547;
                  }
                  auVar4 = *(undefined1 (*) [32])(pMStack_e0 + (long)__size);
                  *(undefined1 (*) [16])(&pMVar12->item_type + (long)__size * 0xc) =
                       *(undefined1 (*) [16])((long)&pMStack_e0[(long)__size].u + 0x10);
                  *(undefined1 (*) [32])(&pMVar12->data + (long)__size * 6) = auVar4;
                }
                __size = (MIR_context_t)(pMStack_e0 + (long)__size);
                pcVar30 = gen_ctx_00->combine_ctx;
                pVVar7 = pcVar30->changed_op_numbers;
              } while( true );
            }
            goto LAB_001710ba;
          }
          goto LAB_00171510;
        }
        if (pVVar27->varr != (MIR_reg_t *)0x0) {
          MVar6 = pVVar27->varr[pVVar27->els_num - 1];
          if (MVar6 == *(MIR_reg_t *)&(insn_00->environment_module).items.head) {
            pMVar26 = get_uptodate_def_insn(gen_ctx_00,MVar6);
            if (pMVar26 != (MIR_insn_t)0x0) {
              uVar14 = (uint)*(MIR_insn_t *)&pMVar26->field_0x18;
              if (uVar14 - 0xaa < 0xfffffffd) {
                target_get_early_clobbered_hard_regs
                          (*(MIR_insn_t *)&pMVar26->field_0x18,&MStack_ec,&MStack_f0);
                if ((((uVar14 < 4) || (MStack_ec != 0xffffffff)) || (MStack_f0 != 0xffffffff)) ||
                   (((*(char *)&(insn_00->environment_module).name != '\x02' ||
                     (*(MIR_reg_t *)&(insn_00->environment_module).items.head != MVar6)) ||
                    ((*(char *)&insn_00->unspec_protos == '\v' &&
                     ((*(MIR_reg_t *)&insn_00->used_label_p == MVar6 ||
                      (*(MIR_reg_t *)((long)&insn_00->used_label_p + 4) == MVar6))))))))
                goto LAB_00171048;
                pvStack_b0 = pMVar26->ops[0].data;
                uStack_a8 = *(undefined8 *)&pMVar26->ops[0].field_0x8;
                iStack_a0 = pMVar26->ops[0].u.i;
                pcStack_98 = pMVar26->ops[0].u.str.s;
                uStack_90 = *(undefined8 *)((long)&pMVar26->ops[0].u + 0x10);
                MStack_88 = pMVar26->ops[0].u.mem.disp;
                pvVar15 = ((MIR_op_t *)&insn_00->insn_nops)->data;
                pVVar16 = insn_00->unspec_protos;
                sVar35 = (((anon_union_32_12_57d33f68_for_u *)&insn_00->temp_string)->str).len;
                pVVar17 = insn_00->temp_data;
                pVVar18 = insn_00->temp_data;
                pVVar19 = insn_00->used_label_p;
                pHVar20 = insn_00->module_item_tab;
                pMVar26->ops[0].u.i =
                     (((anon_union_32_12_57d33f68_for_u *)&insn_00->temp_string)->str).len;
                pMVar26->ops[0].u.str.s = (char *)pVVar18;
                *(VARR_uint8_t **)((long)&pMVar26->ops[0].u + 0x10) = pVVar19;
                pMVar26->ops[0].u.mem.disp = (MIR_disp_t)pHVar20;
                pMVar26->ops[0].data = pvVar15;
                *(VARR_MIR_proto_t **)&pMVar26->ops[0].field_0x8 = pVVar16;
                pMVar26->ops[0].u.i = sVar35;
                pMVar26->ops[0].u.str.s = (char *)pVVar17;
                iVar23 = find_insn_pattern(gen_ctx_00,pMVar26,(int *)0x0);
                pMVar26->ops[0].data = pvStack_b0;
                *(undefined8 *)&pMVar26->ops[0].field_0x8 = uStack_a8;
                pMVar26->ops[0].u.i = iStack_a0;
                pMVar26->ops[0].u.str.s = pcStack_98;
                pMVar26->ops[0].u.i = iStack_a0;
                pMVar26->ops[0].u.str.s = pcStack_98;
                *(undefined8 *)((long)&pMVar26->ops[0].u + 0x10) = uStack_90;
                pMVar26->ops[0].u.mem.disp = MStack_88;
                if (-1 < iVar23) {
                  gen_move_insn_before(gen_ctx_00,(MIR_insn_t)insn_00,pMVar26);
                  if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) &&
                     (1 < gen_ctx_00->debug_level)) {
                    fwrite("      moving insn ",0x12,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pMVar26->data,0);
                    fwrite("      before insn ",0x12,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pgVar22,1);
                  }
                  pvVar15 = ((MIR_op_t *)&insn_00->insn_nops)->data;
                  pVVar16 = insn_00->unspec_protos;
                  sVar35 = (((anon_union_32_12_57d33f68_for_u *)&insn_00->temp_string)->str).len;
                  pVVar17 = insn_00->temp_data;
                  pVVar18 = insn_00->temp_data;
                  pVVar19 = insn_00->used_label_p;
                  pHVar20 = insn_00->module_item_tab;
                  pMVar26->ops[0].u.i =
                       (((anon_union_32_12_57d33f68_for_u *)&insn_00->temp_string)->str).len;
                  pMVar26->ops[0].u.str.s = (char *)pVVar18;
                  *(VARR_uint8_t **)((long)&pMVar26->ops[0].u + 0x10) = pVVar19;
                  pMVar26->ops[0].u.mem.disp = (MIR_disp_t)pHVar20;
                  pMVar26->ops[0].data = pvVar15;
                  *(VARR_MIR_proto_t **)&pMVar26->ops[0].field_0x8 = pVVar16;
                  pMVar26->ops[0].u.i = sVar35;
                  pMVar26->ops[0].u.str.s = (char *)pVVar17;
                  if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) &&
                     (1 < gen_ctx_00->debug_level)) {
                    fwrite("      changing it to ",0x15,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pMVar26->data,1);
                    fwrite("      deleting insn ",0x14,1,(FILE *)gen_ctx_00->debug_file);
                    print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pgVar22,1);
                  }
                  gen_delete_insn(gen_ctx_00,(MIR_insn_t)insn_00);
                  *plStack_e8 = *plStack_e8 + 1;
                  pMStack_f8->gen_ctx = (gen_ctx *)pMVar26->data;
                }
              }
            }
            return;
          }
          goto LAB_00171048;
        }
        goto LAB_00171579;
      }
    }
    combine_substitute_cold_9();
LAB_00171579:
    combine_substitute_cold_1();
    if ((int)__size != -1) {
      pcVar30 = pgVar24->combine_ctx;
      if (pcVar30->var_ref_ages == (VARR_size_t *)0x0) {
        safe_var_substitution_p_cold_1();
        if (cStack_108 == '\v') {
          if (((MStack_f0 == 0xffffffff) ||
              (iVar23 = obsolete_var_p((gen_ctx_t)pgVar24->combine_ctx,MStack_f0,(size_t)__size),
              iVar23 == 0)) && (MStack_ec != 0xffffffff)) {
            obsolete_var_p((gen_ctx_t)pgVar24->combine_ctx,MStack_ec,(size_t)__size);
          }
        }
        else if (cStack_108 == '\x02') {
          obsolete_var_p((gen_ctx_t)pgVar24->combine_ctx,(MIR_reg_t)uStack_100,(size_t)__size);
          return;
        }
        return;
      }
      uVar31 = (ulong)__size & 0xffffffff;
      if (((uVar31 < pcVar30->var_ref_ages->els_num) &&
          (pcVar30->var_ref_ages_addr[uVar31] == pcVar30->curr_bb_var_ref_age)) &&
         (pcVar30->var_refs_addr[uVar31].def_p != '\0')) {
        for (piVar32 = *(int **)(extraout_RDX_00 + 0x38);
            (piVar32 != (int *)0x0 && (*piVar32 != (int)__size)); piVar32 = *(int **)(piVar32 + 4))
        {
        }
      }
    }
    return;
  }
  pcStack_50 = (code *)0x170d66;
  setup_var_ref_cold_5();
LAB_00170d66:
  pcStack_50 = (code *)0x170d85;
  __assert_fail("(VARR_var_ref_tlength (gen_ctx->combine_ctx->var_refs)) == (VARR_size_tlength (gen_ctx->combine_ctx->var_ref_ages))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x22dc,"void setup_var_ref(gen_ctx_t, MIR_reg_t, MIR_insn_t, size_t, size_t, int)")
  ;
LAB_001712ff:
  uVar37 = uStack_d8;
  if (-1 < iVar23) {
    iVar23 = combine_delete_insn(gen_ctx_00,pMVar26,(bb_insn_t_conflict)pgStack_d0);
    if (iVar23 != 0) {
      *plStack_e8 = *plStack_e8 + 1;
    }
    uVar37 = 1;
    if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
      fwrite("      changing to ",0x12,1,(FILE *)gen_ctx_00->debug_file);
      print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)pgVar22,1);
      uVar37 = 1;
    }
  }
LAB_001710ba:
  pVVar27 = gen_ctx_00->combine_ctx->insn_vars;
  if (pVVar27 == (VARR_MIR_reg_t *)0x0) goto LAB_00171508;
  goto LAB_00171078;
}

Assistant:

static void setup_var_ref (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_insn_t insn, size_t nop,
                           size_t insn_num, int def_p) {
  static const var_ref_t var_ref = {NULL, 0, 0, FALSE, FALSE};

  if (var == MIR_NON_VAR) return;
  gen_assert (VARR_LENGTH (var_ref_t, var_refs) == VARR_LENGTH (size_t, var_ref_ages));
  if (VARR_LENGTH (var_ref_t, var_refs) <= var) {
    do {
      VARR_PUSH (size_t, var_ref_ages, 0);
      VARR_PUSH (var_ref_t, var_refs, var_ref);
    } while (VARR_LENGTH (var_ref_t, var_refs) <= var);
    var_refs_addr = VARR_ADDR (var_ref_t, var_refs);
    var_ref_ages_addr = VARR_ADDR (size_t, var_ref_ages);
  }
  var_ref_ages_addr[var] = curr_bb_var_ref_age;
  var_refs_addr[var].insn = insn;
  var_refs_addr[var].nop = nop;
  var_refs_addr[var].insn_num = insn_num;
  var_refs_addr[var].def_p = def_p;
  var_refs_addr[var].del_p = FALSE;
}